

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmsnorm_x86_avx512.cpp
# Opt level: O3

void ncnn::rmsnorm(float *ptr,float *gamma_ptr,float eps,int elemcount,int elempack)

{
  int *piVar1;
  uint *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  byte bVar23;
  byte bVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  uint uVar27;
  long lVar28;
  undefined1 (*pauVar29) [64];
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  int iVar33;
  ushort uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 in_register_00001204 [60];
  float fVar45;
  float fVar49;
  undefined1 auVar46 [16];
  float fVar50;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar61;
  float fVar64;
  undefined1 auVar57 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [28];
  float fVar59;
  float fVar60;
  float fVar62;
  float fVar63;
  undefined1 auVar58 [64];
  float fVar65;
  undefined1 auVar68 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar70;
  undefined1 auVar69 [64];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  
  auVar41._4_60_ = in_register_00001204;
  auVar41._0_4_ = eps;
  uVar27 = elempack * elemcount;
  pauVar29 = (undefined1 (*) [64])ptr;
  if ((int)uVar27 < 0x10) {
    auVar69 = ZEXT864(0);
    uVar30 = 0;
  }
  else {
    uVar30 = uVar27 & 0x7ffffff0;
    auVar69 = ZEXT864(0);
    iVar33 = 0xf;
    do {
      auVar69 = vfmadd231ps_avx512f(auVar69,*pauVar29,*pauVar29);
      pauVar29 = pauVar29 + 1;
      iVar33 = iVar33 + 0x10;
    } while (iVar33 < (int)uVar27);
  }
  auVar35 = ZEXT816(0) << 0x40;
  if ((int)(uVar30 | 7) < (int)uVar27) {
    auVar58 = ZEXT464(0) << 0x40;
    uVar31 = uVar30;
    do {
      auVar35 = vfmadd231ps_fma(auVar58._0_32_,*(undefined1 (*) [32])*pauVar29,
                                *(undefined1 (*) [32])*pauVar29);
      auVar58 = ZEXT1664(auVar35);
      pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
      uVar30 = uVar31 + 8;
      iVar33 = uVar31 + 0xf;
      uVar31 = uVar30;
    } while (iVar33 < (int)uVar27);
  }
  auVar56 = ZEXT1628(auVar35);
  auVar46 = ZEXT816(0) << 0x40;
  if ((int)(uVar30 | 3) < (int)uVar27) {
    auVar58 = ZEXT464(0) << 0x40;
    uVar31 = uVar30;
    do {
      auVar46 = vfmadd231ps_fma(auVar58._0_16_,*(undefined1 (*) [16])*pauVar29,
                                *(undefined1 (*) [16])*pauVar29);
      auVar58 = ZEXT1664(auVar46);
      pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x10);
      uVar30 = uVar31 + 4;
      iVar33 = uVar31 + 7;
      uVar31 = uVar30;
    } while (iVar33 < (int)uVar27);
  }
  auVar53 = ZEXT816(0) << 0x40;
  if ((int)uVar30 < (int)uVar27) {
    auVar37 = vpbroadcastq_avx512f();
    uVar32 = 0;
    auVar38 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      auVar72 = auVar58;
      auVar58 = vpbroadcastq_avx512f();
      auVar40 = vporq_avx512f(auVar58,auVar38);
      auVar58 = vporq_avx512f(auVar58,auVar39);
      uVar20 = vpcmpuq_avx512f(auVar58,auVar37,2);
      bVar23 = (byte)uVar20;
      uVar20 = vpcmpuq_avx512f(auVar40,auVar37,2);
      bVar24 = (byte)uVar20;
      uVar34 = CONCAT11(bVar24,bVar23);
      piVar1 = (int *)(*pauVar29 + uVar32 * 4);
      auVar58._4_4_ = (uint)((byte)(uVar34 >> 1) & 1) * piVar1[1];
      auVar58._0_4_ = (uint)(bVar23 & 1) * *piVar1;
      auVar58._8_4_ = (uint)((byte)(uVar34 >> 2) & 1) * piVar1[2];
      auVar58._12_4_ = (uint)((byte)(uVar34 >> 3) & 1) * piVar1[3];
      auVar58._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * piVar1[4];
      auVar58._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * piVar1[5];
      auVar58._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * piVar1[6];
      auVar58._28_4_ = (uint)((byte)(uVar34 >> 7) & 1) * piVar1[7];
      auVar58._32_4_ = (uint)(bVar24 & 1) * piVar1[8];
      auVar58._36_4_ = (uint)(bVar24 >> 1 & 1) * piVar1[9];
      auVar58._40_4_ = (uint)(bVar24 >> 2 & 1) * piVar1[10];
      auVar58._44_4_ = (uint)(bVar24 >> 3 & 1) * piVar1[0xb];
      auVar58._48_4_ = (uint)(bVar24 >> 4 & 1) * piVar1[0xc];
      auVar58._52_4_ = (uint)(bVar24 >> 5 & 1) * piVar1[0xd];
      auVar58._56_4_ = (uint)(bVar24 >> 6 & 1) * piVar1[0xe];
      auVar58._60_4_ = (uint)(bVar24 >> 7) * piVar1[0xf];
      auVar58 = vfmadd213ps_avx512f(auVar58,auVar58,auVar72);
      uVar32 = uVar32 + 0x10;
    } while (((ulong)(~uVar30 + uVar27) + 0x10 & 0xfffffffffffffff0) != uVar32);
    auVar37._0_4_ = (uint)(bVar23 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar23 & 1) * auVar72._0_4_;
    bVar7 = (bool)((byte)(uVar34 >> 1) & 1);
    auVar37._4_4_ = (uint)bVar7 * auVar58._4_4_ | (uint)!bVar7 * auVar72._4_4_;
    bVar7 = (bool)((byte)(uVar34 >> 2) & 1);
    auVar37._8_4_ = (uint)bVar7 * auVar58._8_4_ | (uint)!bVar7 * auVar72._8_4_;
    bVar7 = (bool)((byte)(uVar34 >> 3) & 1);
    auVar37._12_4_ = (uint)bVar7 * auVar58._12_4_ | (uint)!bVar7 * auVar72._12_4_;
    bVar7 = (bool)((byte)(uVar34 >> 4) & 1);
    auVar37._16_4_ = (uint)bVar7 * auVar58._16_4_ | (uint)!bVar7 * auVar72._16_4_;
    bVar7 = (bool)((byte)(uVar34 >> 5) & 1);
    auVar37._20_4_ = (uint)bVar7 * auVar58._20_4_ | (uint)!bVar7 * auVar72._20_4_;
    bVar7 = (bool)((byte)(uVar34 >> 6) & 1);
    auVar37._24_4_ = (uint)bVar7 * auVar58._24_4_ | (uint)!bVar7 * auVar72._24_4_;
    bVar7 = (bool)((byte)(uVar34 >> 7) & 1);
    auVar37._28_4_ = (uint)bVar7 * auVar58._28_4_ | (uint)!bVar7 * auVar72._28_4_;
    auVar37._32_4_ =
         (uint)(bVar24 & 1) * auVar58._32_4_ | (uint)!(bool)(bVar24 & 1) * auVar72._32_4_;
    bVar7 = (bool)(bVar24 >> 1 & 1);
    auVar37._36_4_ = (uint)bVar7 * auVar58._36_4_ | (uint)!bVar7 * auVar72._36_4_;
    bVar7 = (bool)(bVar24 >> 2 & 1);
    auVar37._40_4_ = (uint)bVar7 * auVar58._40_4_ | (uint)!bVar7 * auVar72._40_4_;
    bVar7 = (bool)(bVar24 >> 3 & 1);
    auVar37._44_4_ = (uint)bVar7 * auVar58._44_4_ | (uint)!bVar7 * auVar72._44_4_;
    bVar7 = (bool)(bVar24 >> 4 & 1);
    auVar37._48_4_ = (uint)bVar7 * auVar58._48_4_ | (uint)!bVar7 * auVar72._48_4_;
    bVar7 = (bool)(bVar24 >> 5 & 1);
    auVar37._52_4_ = (uint)bVar7 * auVar58._52_4_ | (uint)!bVar7 * auVar72._52_4_;
    bVar7 = (bool)(bVar24 >> 6 & 1);
    auVar37._56_4_ = (uint)bVar7 * auVar58._56_4_ | (uint)!bVar7 * auVar72._56_4_;
    auVar37._60_4_ =
         (uint)(bVar24 >> 7) * auVar58._60_4_ | (uint)!(bool)(bVar24 >> 7) * auVar72._60_4_;
    auVar36 = vextractf64x4_avx512f(auVar37,1);
    auVar58 = vaddps_avx512f(auVar37,ZEXT3264(auVar36));
    auVar51._0_4_ = auVar58._0_4_ + auVar58._16_4_;
    auVar51._4_4_ = auVar58._4_4_ + auVar58._20_4_;
    auVar51._8_4_ = auVar58._8_4_ + auVar58._24_4_;
    auVar51._12_4_ = auVar58._12_4_ + auVar58._28_4_;
    auVar53 = vshufpd_avx(auVar51,auVar51,1);
    auVar52._0_4_ = auVar51._0_4_ + auVar53._0_4_;
    auVar52._4_4_ = auVar51._4_4_ + auVar53._4_4_;
    auVar52._8_4_ = auVar51._8_4_ + auVar53._8_4_;
    auVar52._12_4_ = auVar51._12_4_ + auVar53._12_4_;
    auVar53 = vhaddps_avx(auVar52,auVar52);
  }
  if (elempack == 0x10) {
    auVar41 = vbroadcastss_avx512f(auVar41._0_16_);
    auVar58 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / (float)elemcount)));
    auVar69 = vfmadd213ps_avx512f(auVar58,auVar69,auVar41);
    auVar36 = vrsqrtps_avx(auVar69._0_32_);
    auVar41 = ZEXT3264(auVar36);
    auVar36 = vextractf64x4_avx512f(auVar69,1);
    auVar36 = vrsqrtps_avx(auVar36);
    auVar69 = vinsertf64x4_avx512f(auVar41,auVar36,1);
LAB_0059eeef:
    bVar7 = false;
  }
  else {
    fVar65 = auVar69._0_4_;
    fVar70 = auVar69._4_4_;
    fVar45 = auVar35._0_4_;
    fVar59 = auVar35._4_4_;
    fVar49 = auVar35._8_4_;
    fVar50 = auVar35._12_4_;
    fVar60 = auVar69._8_4_;
    fVar61 = auVar69._12_4_;
    fVar62 = auVar69._16_4_;
    fVar63 = auVar69._24_4_;
    fVar64 = auVar69._28_4_;
    if (elempack == 1) {
      auVar36 = vextractf64x4_avx512f(auVar69,1);
      fVar70 = fVar70 + auVar36._4_4_;
      auVar66._0_4_ = fVar65 + auVar36._0_4_ + fVar62 + auVar36._16_4_;
      auVar66._4_4_ = fVar70 + fVar70;
      auVar66._8_4_ = fVar60 + auVar36._8_4_ + fVar63 + auVar36._24_4_;
      auVar66._12_4_ = fVar61 + auVar36._12_4_ + fVar64 + auVar36._28_4_;
      auVar35 = vshufpd_avx(auVar66,auVar66,1);
      auVar67._0_4_ = auVar35._0_4_ + auVar66._0_4_;
      auVar67._4_4_ = auVar35._4_4_ + auVar66._4_4_;
      auVar67._8_4_ = auVar35._8_4_ + auVar66._8_4_;
      auVar67._12_4_ = auVar35._12_4_ + auVar66._12_4_;
      auVar51 = vmovshdup_avx(auVar67);
      auVar55._0_4_ = fVar45 + 0.0;
      auVar55._4_4_ = fVar59 + 0.0;
      auVar55._8_4_ = fVar49 + 0.0;
      auVar55._12_4_ = fVar50 + 0.0;
      auVar35 = vshufps_avx(auVar46,auVar55,0x11);
      auVar46 = vshufps_avx(auVar46,auVar55,0xbb);
      auVar48._0_4_ = auVar46._0_4_ + auVar35._0_4_;
      auVar48._4_4_ = auVar46._4_4_ + auVar35._4_4_;
      auVar48._8_4_ = auVar46._8_4_ + auVar35._8_4_;
      auVar48._12_4_ = auVar46._12_4_ + auVar35._12_4_;
      auVar35 = vshufpd_avx(auVar48,auVar48,1);
      auVar46._0_4_ = auVar48._0_4_ + auVar35._0_4_;
      auVar46._4_4_ = auVar48._4_4_ + auVar35._4_4_;
      auVar46._8_4_ = auVar48._8_4_ + auVar35._8_4_;
      auVar46._12_4_ = auVar48._12_4_ + auVar35._12_4_;
      auVar35 = vhaddps_avx(auVar46,auVar46);
      auVar35 = ZEXT416((uint)((auVar67._0_4_ + auVar51._0_4_ + auVar53._0_4_ + auVar35._0_4_) /
                               (float)elemcount + eps));
      auVar35 = vsqrtss_avx(auVar35,auVar35);
      auVar41 = ZEXT1664(auVar35);
      auVar53 = ZEXT416((uint)(1.0 / auVar35._0_4_));
      auVar69 = vbroadcastss_avx512f(auVar53);
      auVar46 = auVar69._0_16_;
      bVar9 = true;
      bVar7 = false;
      bVar8 = false;
      auVar56 = auVar69._0_28_;
      goto LAB_0059eef7;
    }
    if (elempack == 4) {
      auVar36 = vextractf64x4_avx512f(auVar69,1);
      fVar59 = fVar70 + fVar59 + auVar36._4_4_;
      auVar47._0_4_ =
           fVar62 + 0.0 + auVar36._16_4_ + fVar65 + fVar45 + auVar36._0_4_ + auVar46._0_4_;
      auVar47._4_4_ = fVar59 + fVar59 + auVar46._4_4_;
      auVar47._8_4_ =
           fVar63 + 0.0 + auVar36._24_4_ + fVar60 + fVar49 + auVar36._8_4_ + auVar46._8_4_;
      auVar47._12_4_ =
           fVar64 + 0.0 + auVar36._28_4_ + fVar61 + fVar50 + auVar36._12_4_ + auVar46._12_4_;
      auVar35._4_4_ = eps;
      auVar35._0_4_ = eps;
      auVar35._8_4_ = eps;
      auVar35._12_4_ = eps;
      auVar41 = ZEXT1664(auVar35);
      auVar54._0_4_ = 1.0 / (float)elemcount;
      auVar54._4_4_ = auVar54._0_4_;
      auVar54._8_4_ = auVar54._0_4_;
      auVar54._12_4_ = auVar54._0_4_;
      auVar35 = vfmadd213ps_fma(auVar54,auVar47,auVar35);
      auVar46 = vrsqrtps_avx(auVar35);
      auVar36._16_16_ = auVar46;
      auVar36._0_16_ = auVar46;
      auVar56 = auVar36._0_28_;
      auVar69 = vshuff64x2_avx512f(ZEXT1664(auVar46),ZEXT1664(auVar46),0);
      bVar8 = true;
      bVar9 = false;
      bVar7 = false;
      goto LAB_0059eef7;
    }
    if (elempack != 8) goto LAB_0059eeef;
    auVar36 = vextractf64x4_avx512f(auVar69,1);
    auVar57._0_4_ = fVar65 + fVar45 + auVar36._0_4_;
    auVar57._4_4_ = fVar70 + fVar59 + auVar36._4_4_;
    auVar57._8_4_ = fVar60 + fVar49 + auVar36._8_4_;
    auVar57._12_4_ = fVar61 + fVar50 + auVar36._12_4_;
    auVar57._16_4_ = fVar62 + 0.0 + auVar36._16_4_;
    auVar57._20_4_ = auVar69._20_4_ + 0.0 + auVar36._20_4_;
    auVar57._24_4_ = fVar63 + 0.0 + auVar36._24_4_;
    auVar57._28_4_ = fVar64 + 0.0 + auVar36._28_4_;
    auVar43._4_4_ = eps;
    auVar43._0_4_ = eps;
    auVar43._8_4_ = eps;
    auVar43._12_4_ = eps;
    auVar43._16_4_ = eps;
    auVar43._20_4_ = eps;
    auVar43._24_4_ = eps;
    auVar43._28_4_ = eps;
    auVar41 = ZEXT3264(auVar43);
    auVar68._0_4_ = 1.0 / (float)elemcount;
    auVar68._4_4_ = auVar68._0_4_;
    auVar68._8_4_ = auVar68._0_4_;
    auVar68._12_4_ = auVar68._0_4_;
    auVar68._16_4_ = auVar68._0_4_;
    auVar68._20_4_ = auVar68._0_4_;
    auVar68._24_4_ = auVar68._0_4_;
    auVar68._28_4_ = auVar68._0_4_;
    auVar35 = vfmadd213ps_fma(auVar68,auVar57,auVar43);
    auVar36 = vrsqrtps_avx(ZEXT1632(auVar35));
    auVar56 = auVar36._0_28_;
    auVar69 = vinsertf64x4_avx512f(ZEXT3264(auVar36),auVar36,1);
    bVar7 = true;
  }
  bVar9 = false;
  bVar8 = false;
LAB_0059eef7:
  fVar65 = auVar56._0_4_;
  fVar70 = auVar56._4_4_;
  fVar60 = auVar56._8_4_;
  fVar61 = auVar56._12_4_;
  fVar62 = auVar56._16_4_;
  fVar63 = auVar56._20_4_;
  fVar64 = auVar56._24_4_;
  fVar45 = auVar46._0_4_;
  fVar59 = auVar46._4_4_;
  fVar49 = auVar46._8_4_;
  fVar50 = auVar46._12_4_;
  if (gamma_ptr == (float *)0x0) {
    uVar30 = 0;
    if (0xf < (int)uVar27) {
      uVar30 = uVar27 & 0x7ffffff0;
      iVar33 = 0xf;
      do {
        auVar41 = vmulps_avx512f(auVar69,*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [64])ptr = auVar41;
        ptr = (float *)((long)ptr + 0x40);
        iVar33 = iVar33 + 0x10;
      } while (iVar33 < (int)uVar27);
    }
    uVar31 = uVar30 | 7;
    while ((int)uVar31 < (int)uVar27) {
      auVar69._0_4_ = fVar65 * *(float *)*(undefined1 (*) [64])ptr;
      auVar69._4_4_ = fVar70 * *(float *)(*(undefined1 (*) [64])ptr + 4);
      auVar69._8_4_ = fVar60 * *(float *)(*(undefined1 (*) [64])ptr + 8);
      auVar69._12_4_ = fVar61 * *(float *)(*(undefined1 (*) [64])ptr + 0xc);
      auVar69._16_4_ = fVar62 * *(float *)(*(undefined1 (*) [64])ptr + 0x10);
      auVar69._20_4_ = fVar63 * *(float *)(*(undefined1 (*) [64])ptr + 0x14);
      auVar69._28_36_ = auVar41._28_36_;
      auVar69._24_4_ = fVar64 * *(float *)(*(undefined1 (*) [64])ptr + 0x18);
      auVar41 = ZEXT3264(auVar69._0_32_);
      *(undefined1 (*) [32])*(undefined1 (*) [64])ptr = auVar69._0_32_;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
      uVar31 = uVar30 + 0xf;
      uVar30 = uVar30 + 8;
    }
    uVar31 = uVar30 | 3;
    while ((int)uVar31 < (int)uVar27) {
      fVar65 = *(float *)(*(undefined1 (*) [64])ptr + 4);
      fVar70 = *(float *)(*(undefined1 (*) [64])ptr + 8);
      fVar60 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
      *(float *)*(undefined1 (*) [64])ptr = fVar45 * *(float *)*(undefined1 (*) [64])ptr;
      *(float *)(*(undefined1 (*) [64])ptr + 4) = fVar59 * fVar65;
      *(float *)(*(undefined1 (*) [64])ptr + 8) = fVar49 * fVar70;
      *(float *)(*(undefined1 (*) [64])ptr + 0xc) = fVar50 * fVar60;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
      uVar31 = uVar30 + 7;
      uVar30 = uVar30 + 4;
    }
    if ((int)uVar30 < (int)uVar27) {
      auVar41 = vpbroadcastq_avx512f();
      auVar69 = vbroadcastss_avx512f(auVar53);
      uVar32 = 0;
      auVar58 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar38 = vpbroadcastq_avx512f();
        auVar39 = vporq_avx512f(auVar38,auVar58);
        auVar38 = vporq_avx512f(auVar38,auVar37);
        uVar20 = vpcmpuq_avx512f(auVar38,auVar41,2);
        bVar23 = (byte)uVar20;
        uVar20 = vpcmpuq_avx512f(auVar39,auVar41,2);
        bVar24 = (byte)uVar20;
        uVar34 = CONCAT11(bVar24,bVar23);
        piVar1 = (int *)(*(undefined1 (*) [64])ptr + uVar32 * 4);
        auVar38._4_4_ = (uint)((byte)(uVar34 >> 1) & 1) * piVar1[1];
        auVar38._0_4_ = (uint)(bVar23 & 1) * *piVar1;
        auVar38._8_4_ = (uint)((byte)(uVar34 >> 2) & 1) * piVar1[2];
        auVar38._12_4_ = (uint)((byte)(uVar34 >> 3) & 1) * piVar1[3];
        auVar38._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * piVar1[4];
        auVar38._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * piVar1[5];
        auVar38._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * piVar1[6];
        auVar38._28_4_ = (uint)((byte)(uVar34 >> 7) & 1) * piVar1[7];
        auVar38._32_4_ = (uint)(bVar24 & 1) * piVar1[8];
        auVar38._36_4_ = (uint)(bVar24 >> 1 & 1) * piVar1[9];
        auVar38._40_4_ = (uint)(bVar24 >> 2 & 1) * piVar1[10];
        auVar38._44_4_ = (uint)(bVar24 >> 3 & 1) * piVar1[0xb];
        auVar38._48_4_ = (uint)(bVar24 >> 4 & 1) * piVar1[0xc];
        auVar38._52_4_ = (uint)(bVar24 >> 5 & 1) * piVar1[0xd];
        auVar38._56_4_ = (uint)(bVar24 >> 6 & 1) * piVar1[0xe];
        auVar38._60_4_ = (uint)(bVar24 >> 7) * piVar1[0xf];
        auVar38 = vmulps_avx512f(auVar38,auVar69);
        puVar2 = (uint *)(*(undefined1 (*) [64])ptr + uVar32 * 4);
        bVar7 = (bool)((byte)(uVar34 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar34 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar34 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar34 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar34 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar34 >> 6) & 1);
        bVar13 = (bool)((byte)(uVar34 >> 7) & 1);
        bVar14 = (bool)(bVar24 >> 1 & 1);
        bVar15 = (bool)(bVar24 >> 2 & 1);
        bVar16 = (bool)(bVar24 >> 3 & 1);
        bVar17 = (bool)(bVar24 >> 4 & 1);
        bVar18 = (bool)(bVar24 >> 5 & 1);
        bVar19 = (bool)(bVar24 >> 6 & 1);
        *puVar2 = (uint)(bVar23 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar23 & 1) * *puVar2;
        puVar2[1] = (uint)bVar7 * auVar38._4_4_ | (uint)!bVar7 * puVar2[1];
        puVar2[2] = (uint)bVar8 * auVar38._8_4_ | (uint)!bVar8 * puVar2[2];
        puVar2[3] = (uint)bVar9 * auVar38._12_4_ | (uint)!bVar9 * puVar2[3];
        puVar2[4] = (uint)bVar10 * auVar38._16_4_ | (uint)!bVar10 * puVar2[4];
        puVar2[5] = (uint)bVar11 * auVar38._20_4_ | (uint)!bVar11 * puVar2[5];
        puVar2[6] = (uint)bVar12 * auVar38._24_4_ | (uint)!bVar12 * puVar2[6];
        puVar2[7] = (uint)bVar13 * auVar38._28_4_ | (uint)!bVar13 * puVar2[7];
        puVar2[8] = (uint)(bVar24 & 1) * auVar38._32_4_ | (uint)!(bool)(bVar24 & 1) * puVar2[8];
        puVar2[9] = (uint)bVar14 * auVar38._36_4_ | (uint)!bVar14 * puVar2[9];
        puVar2[10] = (uint)bVar15 * auVar38._40_4_ | (uint)!bVar15 * puVar2[10];
        puVar2[0xb] = (uint)bVar16 * auVar38._44_4_ | (uint)!bVar16 * puVar2[0xb];
        puVar2[0xc] = (uint)bVar17 * auVar38._48_4_ | (uint)!bVar17 * puVar2[0xc];
        puVar2[0xd] = (uint)bVar18 * auVar38._52_4_ | (uint)!bVar18 * puVar2[0xd];
        puVar2[0xe] = (uint)bVar19 * auVar38._56_4_ | (uint)!bVar19 * puVar2[0xe];
        puVar2[0xf] = (uint)(bVar24 >> 7) * auVar38._60_4_ |
                      (uint)!(bool)(bVar24 >> 7) * puVar2[0xf];
        uVar32 = uVar32 + 0x10;
      } while (((ulong)(uVar27 + ~uVar30) + 0x10 & 0xfffffffffffffff0) != uVar32);
    }
  }
  else {
    uVar30 = 0;
    if (0xf < (int)uVar27 && elempack == 0x10) {
      iVar33 = 0xf;
      do {
        auVar41 = vmulps_avx512f(auVar69,*(undefined1 (*) [64])ptr);
        uVar3 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
        auVar39._4_4_ = uVar3;
        auVar39._0_4_ = uVar3;
        auVar39._8_4_ = uVar3;
        auVar39._12_4_ = uVar3;
        auVar39._16_4_ = uVar3;
        auVar39._20_4_ = uVar3;
        auVar39._24_4_ = uVar3;
        auVar39._28_4_ = uVar3;
        auVar39._32_4_ = uVar3;
        auVar39._36_4_ = uVar3;
        auVar39._40_4_ = uVar3;
        auVar39._44_4_ = uVar3;
        auVar39._48_4_ = uVar3;
        auVar39._52_4_ = uVar3;
        auVar39._56_4_ = uVar3;
        auVar39._60_4_ = uVar3;
        auVar41 = vmulps_avx512f(auVar41,auVar39);
        *(undefined1 (*) [64])ptr = auVar41;
        ptr = (float *)((long)ptr + 0x40);
        gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 4);
        iVar33 = iVar33 + 0x10;
        uVar30 = uVar27;
      } while (iVar33 < (int)uVar27);
    }
    if (bVar7) {
      uVar31 = uVar30 | 0xf;
      while ((int)uVar31 < (int)uVar27) {
        uVar3 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
        uVar4 = *(undefined4 *)(*(undefined1 (*) [64])gamma_ptr + 4);
        auVar71._4_4_ = uVar4;
        auVar71._0_4_ = uVar4;
        auVar71._8_4_ = uVar4;
        auVar71._12_4_ = uVar4;
        auVar71._16_4_ = uVar4;
        auVar71._20_4_ = uVar4;
        auVar71._24_4_ = uVar4;
        auVar71._28_4_ = uVar4;
        auVar41 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(
                                                  uVar3,CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(
                                                  uVar3,uVar3)))))))),auVar71,1);
        auVar58 = vmulps_avx512f(auVar69,*(undefined1 (*) [64])ptr);
        auVar41 = vmulps_avx512f(auVar58,auVar41);
        *(undefined1 (*) [64])ptr = auVar41;
        ptr = (float *)((long)ptr + 0x40);
        gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 8);
        uVar31 = uVar30 + 0x1f;
        uVar30 = uVar30 + 0x10;
      }
      uVar31 = uVar30 | 7;
      while ((int)uVar31 < (int)uVar27) {
        auVar40._0_4_ = fVar65 * *(float *)*(undefined1 (*) [64])ptr;
        auVar40._4_4_ = fVar70 * *(float *)(*(undefined1 (*) [64])ptr + 4);
        auVar40._8_4_ = fVar60 * *(float *)(*(undefined1 (*) [64])ptr + 8);
        auVar40._12_4_ = fVar61 * *(float *)(*(undefined1 (*) [64])ptr + 0xc);
        auVar40._16_4_ = fVar62 * *(float *)(*(undefined1 (*) [64])ptr + 0x10);
        auVar40._20_4_ = fVar63 * *(float *)(*(undefined1 (*) [64])ptr + 0x14);
        auVar40._28_36_ = auVar41._28_36_;
        auVar40._24_4_ = fVar64 * *(float *)(*(undefined1 (*) [64])ptr + 0x18);
        uVar3 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
        auVar22._4_4_ = uVar3;
        auVar22._0_4_ = uVar3;
        auVar22._8_4_ = uVar3;
        auVar22._12_4_ = uVar3;
        auVar22._16_4_ = uVar3;
        auVar22._20_4_ = uVar3;
        auVar22._24_4_ = uVar3;
        auVar22._28_4_ = uVar3;
        auVar36 = vmulps_avx512vl(auVar40._0_32_,auVar22);
        auVar41 = ZEXT3264(auVar36);
        *(undefined1 (*) [32])*(undefined1 (*) [64])ptr = auVar36;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 4);
        uVar31 = uVar30 + 0xf;
        uVar30 = uVar30 + 8;
      }
    }
    if (bVar8) {
      iVar33 = uVar30 + 0xf;
      while (iVar33 < (int)uVar27) {
        uVar3 = *(undefined4 *)(*(undefined1 (*) [64])gamma_ptr + 8);
        auVar44._4_4_ = uVar3;
        auVar44._0_4_ = uVar3;
        auVar44._8_4_ = uVar3;
        auVar44._12_4_ = uVar3;
        uVar3 = *(undefined4 *)(*(undefined1 (*) [64])gamma_ptr + 0xc);
        auVar44._20_4_ = uVar3;
        auVar44._16_4_ = uVar3;
        auVar44._24_4_ = uVar3;
        auVar44._28_4_ = uVar3;
        uVar3 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
        uVar4 = *(undefined4 *)(*(undefined1 (*) [64])gamma_ptr + 4);
        auVar41 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT1616(CONCAT412(uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4
                                                                                        ))),
                                                 CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3
                                                                                        ))))),
                             auVar44,1);
        auVar58 = vmulps_avx512f(auVar69,*(undefined1 (*) [64])ptr);
        auVar41 = vmulps_avx512f(auVar58,auVar41);
        *(undefined1 (*) [64])ptr = auVar41;
        ptr = (float *)((long)ptr + 0x40);
        gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 0x10);
        iVar33 = uVar30 + 0x1f;
        uVar30 = uVar30 + 0x10;
      }
      iVar33 = uVar30 + 7;
      while (iVar33 < (int)uVar27) {
        fVar5 = *(float *)*(undefined1 (*) [64])gamma_ptr;
        fVar6 = *(float *)(*(undefined1 (*) [64])gamma_ptr + 4);
        auVar25._4_4_ = fVar70 * *(float *)(*(undefined1 (*) [64])ptr + 4) * fVar5;
        auVar25._0_4_ = fVar65 * *(float *)*(undefined1 (*) [64])ptr * fVar5;
        auVar25._8_4_ = fVar60 * *(float *)(*(undefined1 (*) [64])ptr + 8) * fVar5;
        auVar25._12_4_ = fVar61 * *(float *)(*(undefined1 (*) [64])ptr + 0xc) * fVar5;
        auVar25._16_4_ = fVar62 * *(float *)(*(undefined1 (*) [64])ptr + 0x10) * fVar6;
        auVar25._20_4_ = fVar63 * *(float *)(*(undefined1 (*) [64])ptr + 0x14) * fVar6;
        auVar25._24_4_ = fVar64 * *(float *)(*(undefined1 (*) [64])ptr + 0x18) * fVar6;
        auVar25._28_4_ = fVar6;
        auVar41 = ZEXT3264(auVar25);
        *(undefined1 (*) [32])*(undefined1 (*) [64])ptr = auVar25;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 8);
        iVar33 = uVar30 + 0xf;
        uVar30 = uVar30 + 8;
      }
      iVar33 = uVar30 + 3;
      while (iVar33 < (int)uVar27) {
        auVar42._0_4_ = fVar45 * *(float *)*(undefined1 (*) [64])ptr;
        auVar42._4_4_ = fVar59 * *(float *)(*(undefined1 (*) [64])ptr + 4);
        auVar42._8_4_ = fVar49 * *(float *)(*(undefined1 (*) [64])ptr + 8);
        auVar42._12_4_ = fVar50 * *(float *)(*(undefined1 (*) [64])ptr + 0xc);
        uVar3 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
        auVar21._4_4_ = uVar3;
        auVar21._0_4_ = uVar3;
        auVar21._8_4_ = uVar3;
        auVar21._12_4_ = uVar3;
        auVar35 = vmulps_avx512vl(auVar42,auVar21);
        auVar41 = ZEXT1664(auVar35);
        *(undefined1 (*) [16])*(undefined1 (*) [64])ptr = auVar35;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
        gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 4);
        iVar33 = uVar30 + 7;
        uVar30 = uVar30 + 4;
      }
    }
    if (bVar9) {
      iVar33 = uVar30 + 0xf;
      while (iVar33 < (int)uVar27) {
        auVar41 = vmulps_avx512f(auVar69,*(undefined1 (*) [64])ptr);
        auVar41 = vmulps_avx512f(auVar41,*(undefined1 (*) [64])gamma_ptr);
        *(undefined1 (*) [64])ptr = auVar41;
        ptr = (float *)((long)ptr + 0x40);
        gamma_ptr = (float *)((long)gamma_ptr + 0x40);
        iVar33 = uVar30 + 0x1f;
        uVar30 = uVar30 + 0x10;
      }
      iVar33 = uVar30 + 7;
      while (iVar33 < (int)uVar27) {
        auVar26._4_4_ =
             fVar70 * *(float *)(*(undefined1 (*) [64])ptr + 4) *
             *(float *)(*(undefined1 (*) [64])gamma_ptr + 4);
        auVar26._0_4_ =
             fVar65 * *(float *)*(undefined1 (*) [64])ptr *
             *(float *)*(undefined1 (*) [64])gamma_ptr;
        auVar26._8_4_ =
             fVar60 * *(float *)(*(undefined1 (*) [64])ptr + 8) *
             *(float *)(*(undefined1 (*) [64])gamma_ptr + 8);
        auVar26._12_4_ =
             fVar61 * *(float *)(*(undefined1 (*) [64])ptr + 0xc) *
             *(float *)(*(undefined1 (*) [64])gamma_ptr + 0xc);
        auVar26._16_4_ =
             fVar62 * *(float *)(*(undefined1 (*) [64])ptr + 0x10) *
             *(float *)(*(undefined1 (*) [64])gamma_ptr + 0x10);
        auVar26._20_4_ =
             fVar63 * *(float *)(*(undefined1 (*) [64])ptr + 0x14) *
             *(float *)(*(undefined1 (*) [64])gamma_ptr + 0x14);
        auVar26._24_4_ =
             fVar64 * *(float *)(*(undefined1 (*) [64])ptr + 0x18) *
             *(float *)(*(undefined1 (*) [64])gamma_ptr + 0x18);
        auVar26._28_4_ = auVar41._28_4_;
        auVar41 = ZEXT3264(auVar26);
        *(undefined1 (*) [32])*(undefined1 (*) [64])ptr = auVar26;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 0x20);
        iVar33 = uVar30 + 0xf;
        uVar30 = uVar30 + 8;
      }
      iVar33 = uVar30 + 3;
      while (iVar33 < (int)uVar27) {
        fVar65 = *(float *)(*(undefined1 (*) [64])ptr + 4);
        fVar70 = *(float *)(*(undefined1 (*) [64])ptr + 8);
        fVar60 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
        fVar61 = *(float *)(*(undefined1 (*) [64])gamma_ptr + 4);
        fVar62 = *(float *)(*(undefined1 (*) [64])gamma_ptr + 8);
        fVar63 = *(float *)(*(undefined1 (*) [64])gamma_ptr + 0xc);
        *(float *)*(undefined1 (*) [64])ptr =
             fVar45 * *(float *)*(undefined1 (*) [64])ptr *
             *(float *)*(undefined1 (*) [64])gamma_ptr;
        *(float *)(*(undefined1 (*) [64])ptr + 4) = fVar59 * fVar65 * fVar61;
        *(float *)(*(undefined1 (*) [64])ptr + 8) = fVar49 * fVar70 * fVar62;
        *(float *)(*(undefined1 (*) [64])ptr + 0xc) = fVar50 * fVar60 * fVar63;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
        gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 0x10);
        iVar33 = uVar30 + 7;
        uVar30 = uVar30 + 4;
      }
    }
    if (uVar27 - uVar30 != 0 && (int)uVar30 <= (int)uVar27) {
      lVar28 = 0;
      do {
        *(float *)(*(undefined1 (*) [64])ptr + lVar28 * 4) =
             auVar53._0_4_ * *(float *)(*(undefined1 (*) [64])ptr + lVar28 * 4) *
             *(float *)(*(undefined1 (*) [64])gamma_ptr + lVar28 * 4);
        lVar28 = lVar28 + 1;
      } while (uVar27 - uVar30 != (int)lVar28);
    }
  }
  return;
}

Assistant:

static void rmsnorm(float* ptr, const float* gamma_ptr, float eps, int elemcount, int elempack)
{
    const int size = elemcount * elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _rms_avx512 = _mm512_set1_ps(0.f);
#endif // __AVX512F__
    __m256 _rms_avx = _mm256_set1_ps(0.f);
#endif // __AVX__
    __m128 _rms = _mm_set1_ps(0.f);
#endif // __SSE2__
    float rms = 0.f;
    {
        const float* ptr0 = ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr0);
            _rms_avx512 = _mm512_fmadd_ps(_p, _p, _rms_avx512);
            ptr0 += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr0);
            _rms_avx = _mm256_comp_fmadd_ps(_p, _p, _rms_avx);
            ptr0 += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr0);
            _rms = _mm_comp_fmadd_ps(_p, _p, _rms);
            ptr0 += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            rms += ptr0[0] * ptr0[0];
            ptr0++;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        __m512 _elemcount = _mm512_set1_ps((float)elemcount);
        __m512 _eps = _mm512_set1_ps(eps);

        _rms_avx512 = _mm512_div_ps(_rms_avx512, _elemcount);
        _rms_avx512 = _mm512_add_ps(_rms_avx512, _eps);

        __m256 _rms0 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_rms_avx512, 0));
        __m256 _rms1 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_rms_avx512, 1));
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms0), _rms1, 1);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
#if __AVX512F__
        {
            __m256 _rms0 = _mm512_castps512_ps256(_rms_avx512);
            __m256 _rms1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_rms_avx512), 1));
            _rms_avx = _mm256_add_ps(_rms_avx, _rms0);
            _rms_avx = _mm256_add_ps(_rms_avx, _rms1);
        }
#endif // __AVX512F__

        __m256 _elemcount = _mm256_set1_ps((float)elemcount);
        __m256 _eps = _mm256_set1_ps(eps);

        _rms_avx = _mm256_div_ps(_rms_avx, _elemcount);
        _rms_avx = _mm256_add_ps(_rms_avx, _eps);

        _rms_avx = _mm256_rsqrt_ps(_rms_avx);
#if __AVX512F__
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms_avx), _rms_avx, 1);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 4)
    {
#if __AVX__
#if __AVX512F__
        {
            __m256 _rms0 = _mm512_castps512_ps256(_rms_avx512);
            __m256 _rms1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_rms_avx512), 1));
            _rms_avx = _mm256_add_ps(_rms_avx, _rms0);
            _rms_avx = _mm256_add_ps(_rms_avx, _rms1);
        }
#endif // __AVX512F__
        {
            __m128 _rms0 = _mm256_castps256_ps128(_rms_avx);
            __m128 _rms1 = _mm256_extractf128_ps(_rms_avx, 1);
            _rms = _mm_add_ps(_rms, _rms0);
            _rms = _mm_add_ps(_rms, _rms1);
        }
#endif // __AVX__

        __m128 _elemcount = _mm_set1_ps((float)elemcount);
        __m128 _eps = _mm_set1_ps(eps);

        _rms = _mm_div_ps(_rms, _elemcount);
        _rms = _mm_add_ps(_rms, _eps);

        _rms = _mm_rsqrt_ps(_rms);
#if __AVX__
        _rms_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_rms), _rms, 1);
#if __AVX512F__
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms_avx), _rms_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__
    if (elempack == 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        rms += _mm512_comp_reduce_add_ps(_rms_avx512);
#endif // __AVX512F__
        rms += _mm256_reduce_add_ps(_rms_avx);
#endif // __AVX__
        rms += _mm_reduce_add_ps(_rms);
#endif // __SSE2__

        rms = 1.f / sqrtf(rms / elemcount + eps);
#if __SSE2__
        _rms = _mm_set1_ps(rms);
#if __AVX__
        _rms_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_rms), _rms, 1);
#if __AVX512F__
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms_avx), _rms_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__
    }

    if (gamma_ptr)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_set1_ps(gamma_ptr[0]);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 1;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m256 _gamma0 = _mm256_set1_ps(gamma_ptr[0]);
                __m256 _gamma1 = _mm256_set1_ps(gamma_ptr[1]);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma0), _gamma1, 1);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 2;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_set1_ps(gamma_ptr[0]);
                _p = _mm256_mul_ps(_p, _rms_avx);
                _p = _mm256_mul_ps(_p, _gamma);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 1;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m128 _gamma2 = _mm_set1_ps(gamma_ptr[2]);
                __m128 _gamma3 = _mm_set1_ps(gamma_ptr[3]);
                __m256 _gamma01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                __m256 _gamma23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma2), _gamma3, 1);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma01), _gamma23, 1);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 4;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m256 _gamma = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                _p = _mm256_mul_ps(_p, _rms_avx);
                _p = _mm256_mul_ps(_p, _gamma);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 2;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_set1_ps(gamma_ptr[0]);
                _p = _mm_mul_ps(_p, _rms);
                _p = _mm_mul_ps(_p, _gamma);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 1;
            }
        }
        if (elempack == 1)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_loadu_ps(gamma_ptr);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_loadu_ps(gamma_ptr);
                _p = _mm256_mul_ps(_p, _rms_avx);
                _p = _mm256_mul_ps(_p, _gamma);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_loadu_ps(gamma_ptr);
                _p = _mm_mul_ps(_p, _rms);
                _p = _mm_mul_ps(_p, _gamma);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 4;
            }
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = (ptr[0] * rms) * gamma_ptr[0];
            ptr++;
            gamma_ptr++;
        }
    }
    else
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_mul_ps(_p, _rms_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_mul_ps(_p, _rms_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = _mm_mul_ps(_p, _rms);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = ptr[0] * rms;
            ptr++;
        }
    }
}